

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::CopyImage::SamplesMissMatchTest::iterate(SamplesMissMatchTest *this)

{
  ostringstream *this_00;
  GLenum GVar1;
  pointer ptVar2;
  int iVar3;
  GLuint GVar4;
  GLenum GVar5;
  IterateResult IVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar7;
  ulong uVar8;
  Enum<int,_2UL> local_1f0;
  Enum<int,_2UL> local_1e0;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  uVar7 = this->m_test_case_index;
  ptVar2 = (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  GVar4 = Utils::prepareMultisampleTex
                    ((this->super_TestCase).m_context,ptVar2[uVar7].m_dst_target,
                     ptVar2[uVar7].m_dst_n_samples);
  ptVar2 = ptVar2 + uVar7;
  this->m_dst_tex_name = GVar4;
  GVar4 = Utils::prepareMultisampleTex
                    ((this->super_TestCase).m_context,ptVar2->m_src_target,ptVar2->m_src_n_samples);
  this->m_src_tex_name = GVar4;
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0x310))
            (GVar4,ptVar2->m_src_target,0,0,0,0,this->m_dst_tex_name,ptVar2->m_dst_target,0,0,0,0,1,
             1,1);
  GVar5 = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  GVar1 = ptVar2->m_expected_result;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x480))(1,&this->m_dst_tex_name);
  (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x480))(1);
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  if (GVar1 == GVar5) {
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    uVar7 = this->m_test_case_index + 1;
    this->m_test_case_index = uVar7;
    uVar8 = ((long)(this->m_test_cases).
                   super__Vector_base<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_test_cases).
                   super__Vector_base<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
    IVar6 = (IterateResult)(uVar7 <= uVar8 && uVar8 - uVar7 != 0);
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Failure. Expected result: ",0x1a);
    local_1c0.m_value = ptVar2->m_expected_result;
    local_1c0.m_getName = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," got: ",6);
    local_1d0.m_getName = glu::getErrorName;
    local_1d0.m_value = GVar5;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". Source target: ",0x11);
    local_1e0.m_value = ptVar2->m_src_target;
    local_1e0.m_getName = glu::getTextureTargetName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1e0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," samples: ",10);
    std::ostream::operator<<(this_00,ptVar2->m_src_n_samples);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,", destination target: ",0x16);
    local_1f0.m_value = ptVar2->m_dst_target;
    local_1f0.m_getName = glu::getTextureTargetName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1f0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," samples: ",10);
    std::ostream::operator<<(this_00,ptVar2->m_dst_n_samples);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
    IVar6 = STOP;
  }
  return IVar6;
}

Assistant:

tcu::TestNode::IterateResult SamplesMissMatchTest::iterate()
{
	GLenum						 error	 = GL_NO_ERROR;
	const Functions&			 gl		   = m_context.getRenderContext().getFunctions();
	tcu::TestNode::IterateResult it_result = tcu::TestNode::STOP;
	bool						 result	= false;
	const testCase&				 test_case = m_test_cases[m_test_case_index];

	try
	{
		/* Prepare textures */
		m_dst_tex_name = Utils::prepareMultisampleTex(m_context, test_case.m_dst_target, test_case.m_dst_n_samples);
		m_src_tex_name = Utils::prepareMultisampleTex(m_context, test_case.m_src_target, test_case.m_src_n_samples);
	}
	catch (tcu::Exception& exc)
	{
		clean();
		throw exc;
	}

	/* Execute CopyImageSubData */
	gl.copyImageSubData(m_src_tex_name, test_case.m_src_target, 0 /* srcLevel */, 0 /* srcX */, 0 /* srcY */,
						0 /* srcZ */, m_dst_tex_name, test_case.m_dst_target, 0 /* dstLevel */, 0 /* dstX */,
						0 /* dstY */, 0 /* dstZ */, 1 /* srcWidth */, 1 /* srcHeight */, 1 /* srcDepth */);

	/* Verify generated error */
	error  = gl.getError();
	result = (test_case.m_expected_result == error);

	/* Free resources */
	clean();

	/* Set result */
	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

		/* Increase index */
		m_test_case_index += 1;

		/* Are there any test cases left */
		if (m_test_cases.size() > m_test_case_index)
		{
			it_result = tcu::TestNode::CONTINUE;
		}
	}
	else
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Failure. Expected result: " << glu::getErrorStr(test_case.m_expected_result)
			<< " got: " << glu::getErrorStr(error)
			<< ". Source target: " << glu::getTextureTargetStr(test_case.m_src_target)
			<< " samples: " << test_case.m_src_n_samples
			<< ", destination target: " << glu::getTextureTargetStr(test_case.m_dst_target)
			<< " samples: " << test_case.m_dst_n_samples << tcu::TestLog::EndMessage;

		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return it_result;
}